

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O3

void initMakeData(void)

{
  QMultiHash<char,_QLatin1String> QVar1;
  QMultiHash<char,_QLatin1String> QVar2;
  QMultiHash<char,_QLatin1String> QVar3;
  QMultiHash<char,_QLatin1String> QVar4;
  Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *pDVar5;
  long lVar6;
  char local_3f9;
  QMultiHash<char,_QLatin1String> local_3f8;
  iterator local_3e8;
  undefined1 local_3d0 [16];
  char *local_3c0;
  undefined1 local_3b8;
  undefined8 local_3b0;
  char *local_3a8;
  undefined1 local_3a0;
  undefined8 local_398;
  char *local_390;
  undefined1 local_388;
  undefined8 local_380;
  char *local_378;
  undefined1 local_370;
  undefined8 local_368;
  char *local_360;
  undefined1 local_358;
  undefined8 local_350;
  char *local_348;
  undefined1 local_340;
  undefined8 local_338;
  char *local_330;
  undefined1 local_328;
  undefined8 local_320;
  char *local_318;
  undefined1 local_310;
  undefined8 local_308;
  char *local_300;
  undefined1 local_2f8;
  undefined8 local_2f0;
  char *local_2e8;
  undefined1 local_2e0;
  undefined8 local_2d8;
  char *local_2d0;
  undefined1 local_2c8;
  undefined8 local_2c0;
  char *local_2b8;
  undefined1 local_2b0;
  undefined8 local_2a8;
  char *local_2a0;
  undefined1 local_298;
  undefined8 local_290;
  char *local_288;
  undefined1 local_280;
  undefined8 local_278;
  char *local_270;
  undefined1 local_268;
  undefined8 local_260;
  char *local_258;
  undefined1 local_250;
  undefined8 local_248;
  char *local_240;
  undefined1 local_238;
  undefined8 local_230;
  char *local_228;
  undefined1 local_220;
  undefined8 local_218;
  char *local_210;
  undefined1 local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined1 local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  undefined1 local_1d8;
  undefined8 local_1d0;
  char *local_1c8;
  undefined1 local_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  undefined1 local_1a8;
  undefined8 local_1a0;
  char *local_198;
  undefined1 local_190;
  undefined8 local_188;
  char *local_180;
  undefined1 local_178;
  undefined8 local_170;
  char *local_168;
  undefined1 local_160;
  undefined8 local_158;
  char *local_150;
  undefined1 local_148;
  undefined8 local_140;
  char *local_138;
  undefined1 local_130;
  undefined8 local_128;
  char *local_120;
  undefined1 local_118;
  undefined8 local_110;
  char *local_108;
  undefined1 local_100;
  undefined8 local_f8;
  char *local_f0;
  undefined1 local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined1 local_d0;
  undefined8 local_c8;
  char *local_c0;
  undefined1 local_b8;
  undefined8 local_b0;
  char *local_a8;
  undefined1 local_a0;
  undefined8 local_98;
  char *local_90;
  undefined1 local_88;
  undefined8 local_80;
  char *local_78;
  undefined1 local_70;
  undefined8 local_68;
  char *local_60;
  undefined1 local_58;
  undefined8 local_50;
  char *local_48;
  undefined1 local_40;
  undefined8 local_38;
  char *local_30;
  
  local_3d0[0] = 0x69;
  local_3d0._8_8_ = 7;
  local_3c0 = "include";
  local_3b8 = 100;
  local_3b0 = 6;
  local_3a8 = "define";
  local_3a0 = 0x65;
  local_398 = 4;
  local_390 = "else";
  local_388 = 0x65;
  local_380 = 5;
  local_378 = "endef";
  local_370 = 0x65;
  local_368 = 5;
  local_360 = "endif";
  local_358 = 0x65;
  local_350 = 6;
  local_348 = "export";
  local_340 = 0x69;
  local_338 = 7;
  local_330 = "ifn?def";
  local_328 = 0x69;
  local_320 = 6;
  local_318 = "ifn?eq";
  local_310 = 0x69;
  local_308 = 7;
  local_300 = "include";
  local_2f8 = 0x6f;
  local_2f0 = 8;
  local_2e8 = "override";
  local_2e0 = 0x70;
  local_2d8 = 7;
  local_2d0 = "private";
  local_2c8 = 0x73;
  local_2c0 = 8;
  local_2b8 = "sinclude";
  local_2b0 = 0x75;
  local_2a8 = 8;
  local_2a0 = "undefine";
  local_298 = 0x75;
  local_290 = 8;
  local_288 = "unexport";
  local_280 = 0x76;
  local_278 = 5;
  local_270 = "vpath";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0xf);
  local_3f8.m_size = 0;
  lVar6 = 0;
  local_3f8.d = pDVar5;
  do {
    local_3f9 = local_3d0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_3e8,&local_3f8,&local_3f9,(QLatin1String *)(local_3d0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x168);
  QVar1.m_size = local_3f8.m_size;
  QVar1.d = local_3f8.d;
  local_3f8.d = (Data *)0x0;
  local_3f8.m_size = 0;
  local_3e8.i.d = make_keywords.d;
  local_3e8.i.bucket = make_keywords.m_size;
  make_keywords = QVar1;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3f8);
  local_3d0[0] = 0x61;
  local_3d0._8_8_ = 9;
  local_3c0 = "addsuffix";
  local_3b8 = 0x61;
  local_3b0 = 7;
  local_3a8 = "abspath";
  local_3a0 = 0x61;
  local_398 = 3;
  local_390 = "and";
  local_388 = 0x61;
  local_380 = 2;
  local_378 = "ar";
  local_370 = 0x62;
  local_368 = 8;
  local_360 = "basename";
  local_358 = 99;
  local_350 = 4;
  local_348 = "call";
  local_340 = 100;
  local_338 = 3;
  local_330 = "dir";
  local_328 = 0x65;
  local_320 = 5;
  local_318 = "error";
  local_310 = 0x65;
  local_308 = 4;
  local_300 = "eval";
  local_2f8 = 0x66;
  local_2f0 = 4;
  local_2e8 = "file";
  local_2e0 = 0x66;
  local_2d8 = 6;
  local_2d0 = "filter";
  local_2c8 = 0x66;
  local_2c0 = 4;
  local_2b8 = "find";
  local_2b0 = 0x66;
  local_2a8 = 10;
  local_2a0 = "findstring";
  local_298 = 0x66;
  local_290 = 9;
  local_288 = "firstword";
  local_280 = 0x66;
  local_278 = 6;
  local_270 = "flavor";
  local_268 = 0x66;
  local_260 = 7;
  local_258 = "foreach";
  local_250 = 0x67;
  local_248 = 5;
  local_240 = "guile";
  local_238 = 0x69;
  local_230 = 2;
  local_228 = "if";
  local_220 = 0x69;
  local_218 = 4;
  local_210 = "info";
  local_208 = 0x69;
  local_200 = 7;
  local_1f8 = "install";
  local_1f0 = 0x6a;
  local_1e8 = 4;
  local_1e0 = "join";
  local_1d8 = 0x6c;
  local_1d0 = 8;
  local_1c8 = "lastword";
  local_1c0 = 0x6c;
  local_1b8 = 4;
  local_1b0 = "load";
  local_1a8 = 0x6e;
  local_1a0 = 6;
  local_198 = "notdir";
  local_190 = 0x6f;
  local_188 = 2;
  local_180 = "or";
  local_178 = 0x6f;
  local_170 = 6;
  local_168 = "origin";
  local_160 = 0x70;
  local_158 = 8;
  local_150 = "patsubst";
  local_148 = 0x72;
  local_140 = 6;
  local_138 = "ranlib";
  local_130 = 0x72;
  local_128 = 8;
  local_120 = "realpath";
  local_118 = 0x72;
  local_110 = 2;
  local_108 = "rm";
  local_100 = 0x73;
  local_f8 = 5;
  local_f0 = "shell";
  local_e8 = 0x73;
  local_e0 = 4;
  local_d8 = "sort";
  local_d0 = 0x73;
  local_c8 = 5;
  local_c0 = "strip";
  local_b8 = 0x73;
  local_b0 = 5;
  local_a8 = "subst";
  local_a0 = 0x73;
  local_98 = 6;
  local_90 = "suffix";
  local_88 = 0x76;
  local_80 = 5;
  local_78 = "value";
  local_70 = 0x77;
  local_68 = 7;
  local_60 = "warning";
  local_58 = 0x77;
  local_50 = 8;
  local_48 = "wildcard";
  local_40 = 0x77;
  local_38 = 4;
  local_30 = "word";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,0x27);
  local_3f8.m_size = 0;
  lVar6 = 0;
  local_3f8.d = pDVar5;
  do {
    local_3f9 = local_3d0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_3e8,&local_3f8,&local_3f9,(QLatin1String *)(local_3d0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x3a8);
  QVar2.m_size = local_3f8.m_size;
  QVar2.d = local_3f8.d;
  local_3f8.d = (Data *)0x0;
  local_3f8.m_size = 0;
  local_3e8.i.d = make_types.d;
  local_3e8.i.bucket = make_types.m_size;
  make_types = QVar2;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3f8);
  local_3d0[0] = 0x74;
  local_3d0._8_8_ = 4;
  local_3c0 = "true";
  local_3b8 = 0x66;
  local_3b0 = 5;
  local_3a8 = "false";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,2);
  local_3f8.m_size = 0;
  lVar6 = 0;
  local_3f8.d = pDVar5;
  do {
    local_3f9 = local_3d0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_3e8,&local_3f8,&local_3f9,(QLatin1String *)(local_3d0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x30);
  QVar3.m_size = local_3f8.m_size;
  QVar3.d = local_3f8.d;
  local_3f8.d = (Data *)0x0;
  local_3f8.m_size = 0;
  local_3e8.i.d = make_literals.d;
  local_3e8.i.bucket = make_literals.m_size;
  make_literals = QVar3;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3f8);
  local_3e8.i = (piter)ZEXT816(0);
  local_3d0._0_8_ = make_builtin.d;
  local_3d0._8_8_ = make_builtin.m_size;
  make_builtin = (QMultiHash<char,_QLatin1String>)ZEXT816(0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)local_3d0);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_3e8);
  local_3d0[0] = 0x43;
  local_3d0._8_8_ = 6;
  local_3c0 = "CFLAGS";
  local_3b8 = 0x4c;
  local_3b0 = 4;
  local_3a8 = "LIBS";
  local_3a0 = 0x50;
  local_398 = 6;
  local_390 = "PREFIX";
  pDVar5 = (Data<QHashPrivate::MultiNode<char,_QLatin1String>_> *)operator_new(0x28);
  QHashPrivate::Data<QHashPrivate::MultiNode<char,_QLatin1String>_>::Data(pDVar5,3);
  local_3f8.m_size = 0;
  lVar6 = 0;
  local_3f8.d = pDVar5;
  do {
    local_3f9 = local_3d0[lVar6];
    QMultiHash<char,QLatin1String>::emplace<QLatin1String_const&>
              (&local_3e8,&local_3f8,&local_3f9,(QLatin1String *)(local_3d0 + lVar6 + 8));
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x48);
  QVar4.m_size = local_3f8.m_size;
  QVar4.d = local_3f8.d;
  local_3f8.d = (Data *)0x0;
  local_3f8.m_size = 0;
  local_3e8.i.d = make_other.d;
  local_3e8.i.bucket = make_other.m_size;
  make_other = QVar4;
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_3e8);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&local_3f8);
  return;
}

Assistant:

void initMakeData() {
    make_keywords = {
        {'i', QLatin1String("include")},  {'d', QLatin1String("define")},
        {'e', QLatin1String("else")},     {'e', QLatin1String("endef")},
        {'e', QLatin1String("endif")},    {'e', QLatin1String("export")},
        {'i', QLatin1String("ifn?def")},  {'i', QLatin1String("ifn?eq")},
        {'i', QLatin1String("include")},  {'o', QLatin1String("override")},
        {'p', QLatin1String("private")},  {'s', QLatin1String("sinclude")},
        {'u', QLatin1String("undefine")}, {'u', QLatin1String("unexport")},
        {'v', QLatin1String("vpath")}};
    make_types = {
        {'a', QLatin1String("addsuffix")},  {'a', QLatin1String("abspath")},
        {'a', QLatin1String("and")},        {'a', QLatin1String("ar")},
        {'b', QLatin1String("basename")},   {'c', QLatin1String("call")},
        {'d', QLatin1String("dir")},        {'e', QLatin1String("error")},
        {'e', QLatin1String("eval")},       {'f', QLatin1String("file")},
        {'f', QLatin1String("filter")},     {'f', QLatin1String("find")},
        {'f', QLatin1String("findstring")}, {'f', QLatin1String("firstword")},
        {'f', QLatin1String("flavor")},     {'f', QLatin1String("foreach")},
        {'g', QLatin1String("guile")},      {'i', QLatin1String("if")},
        {'i', QLatin1String("info")},       {'i', QLatin1String("install")},
        {'j', QLatin1String("join")},       {'l', QLatin1String("lastword")},
        {'l', QLatin1String("load")},       {'n', QLatin1String("notdir")},
        {'o', QLatin1String("or")},         {'o', QLatin1String("origin")},
        {'p', QLatin1String("patsubst")},   {'r', QLatin1String("ranlib")},
        {'r', QLatin1String("realpath")},   {'r', QLatin1String("rm")},
        {'s', QLatin1String("shell")},      {'s', QLatin1String("sort")},
        {'s', QLatin1String("strip")},      {'s', QLatin1String("subst")},
        {'s', QLatin1String("suffix")},     {'v', QLatin1String("value")},
        {'w', QLatin1String("warning")},    {'w', QLatin1String("wildcard")},
        {'w', QLatin1String("word")}};
    make_literals = {
        {'t', QLatin1String("true")},
        {'f', QLatin1String("false")},
    };
    make_builtin = {};
    make_other = {
        {'C', QLatin1String("CFLAGS")},
        {'L', QLatin1String("LIBS")},
        {'P', QLatin1String("PREFIX")},
    };
}